

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_render_batch *
rf_create_custom_render_batch
          (rf_render_batch *__return_storage_ptr__,rf_int vertex_buffers_count,
          rf_int draw_calls_count,rf_int vertex_buffer_elements_count,rf_allocator allocator)

{
  rf_source_location rVar1;
  undefined1 auVar2 [24];
  rf_vertex_buffer *buffers;
  rf_vertex_buffer *vertex_buffers;
  rf_int one_vertex_buffer_memory_size;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  rf_int rVar7;
  long lVar8;
  long lVar9;
  uint uStack_5c;
  rf_allocator local_40;
  
  local_40.allocator_proc = allocator.allocator_proc;
  local_40.user_data = allocator.user_data;
  __return_storage_ptr__->draw_calls_counter = 0;
  __return_storage_ptr__->draw_calls = (rf_draw_call *)0x0;
  __return_storage_ptr__->vertex_buffers = (rf_vertex_buffer *)0x0;
  __return_storage_ptr__->draw_calls_size = 0;
  __return_storage_ptr__->vertex_buffers_count = 0;
  __return_storage_ptr__->current_buffer = 0;
  __return_storage_ptr__->current_depth = 0.0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x35 = 0;
  if (-1 < (draw_calls_count | vertex_buffers_count | vertex_buffer_elements_count)) {
    lVar3 = vertex_buffer_elements_count * 0x78;
    lVar8 = draw_calls_count * 0x10 + vertex_buffers_count * 0x48;
    rVar1.proc_name = "rf_create_custom_render_batch";
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.line_in_file = 0x5e1e;
    auVar2._8_8_ = (ulong)uStack_5c << 0x20;
    auVar2._0_8_ = lVar3 * vertex_buffers_count + lVar8;
    auVar2._16_8_ = 0;
    vertex_buffers =
         (rf_vertex_buffer *)
         (*local_40.allocator_proc)(&local_40,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40))
    ;
    if (vertex_buffers != (rf_vertex_buffer *)0x0) {
      if (0 < vertex_buffers_count) {
        lVar6 = lVar8 + vertex_buffer_elements_count * 0x24;
        lVar9 = lVar8 + vertex_buffer_elements_count * 8;
        lVar4 = vertex_buffer_elements_count * 0x10 + lVar8;
        lVar5 = 0x40;
        rVar7 = vertex_buffers_count;
        do {
          *(int *)((long)vertex_buffers->vbo_id + lVar5 + -0x54) = (int)vertex_buffer_elements_count
          ;
          *(long *)((long)vertex_buffers->vbo_id + lVar5 + -0x2c) =
               (long)vertex_buffers->vbo_id + lVar8 + -0x14;
          *(long *)((long)vertex_buffers->vbo_id + lVar5 + -0x24) =
               (long)vertex_buffers->vbo_id + lVar4 + -0x14;
          *(long *)((long)vertex_buffers->vbo_id + lVar5 + -0x1c) =
               (long)vertex_buffers->vbo_id + lVar9 + -0x14;
          *(long *)((long)vertex_buffers->vbo_id + lVar5 + -0x14) =
               (long)vertex_buffers->vbo_id + lVar6 + -0x14;
          lVar5 = lVar5 + 0x48;
          lVar8 = lVar8 + lVar3;
          lVar6 = lVar6 + lVar3;
          lVar4 = lVar4 + lVar3;
          lVar9 = lVar9 + lVar3;
          rVar7 = rVar7 + -1;
        } while (rVar7 != 0);
      }
      rf_create_custom_render_batch_from_buffers
                (__return_storage_ptr__,vertex_buffers,vertex_buffers_count,
                 (rf_draw_call *)(vertex_buffers + vertex_buffers_count),draw_calls_count);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_render_batch rf_create_custom_render_batch(rf_int vertex_buffers_count, rf_int draw_calls_count, rf_int vertex_buffer_elements_count, rf_allocator allocator)
{
    if (vertex_buffers_count < 0 || draw_calls_count < 0 || vertex_buffer_elements_count < 0) {
        return (rf_render_batch) {0};
    }

    rf_render_batch result = {0};

    rf_int vertex_buffer_array_size = sizeof(rf_vertex_buffer) * vertex_buffers_count;
    rf_int vertex_buffers_memory_size = (sizeof(rf_one_element_vertex_buffer) * vertex_buffer_elements_count) * vertex_buffers_count;
    rf_int draw_calls_array_size = sizeof(rf_draw_call) * draw_calls_count;
    rf_int allocation_size = vertex_buffer_array_size + draw_calls_array_size + vertex_buffers_memory_size;

    char* memory = RF_ALLOC(allocator, allocation_size);

    if (memory)
    {
        rf_vertex_buffer* buffers = (rf_vertex_buffer*) memory;
        rf_draw_call* draw_calls = (rf_draw_call*) (memory + vertex_buffer_array_size);
        char* buffers_memory = memory + vertex_buffer_array_size + draw_calls_array_size;

        RF_ASSERT(((char*)draw_calls - memory) == draw_calls_array_size + vertex_buffers_memory_size);
        RF_ASSERT((buffers_memory - memory) == vertex_buffers_memory_size);
        RF_ASSERT((buffers_memory - memory) == sizeof(rf_one_element_vertex_buffer) * vertex_buffer_elements_count * vertex_buffers_count);

        for (rf_int i = 0; i < vertex_buffers_count; i++)
        {
            rf_int one_vertex_buffer_memory_size = sizeof(rf_one_element_vertex_buffer) * vertex_buffer_elements_count;
            rf_int vertices_size = sizeof(rf_gfx_vertex_data_type) * vertex_buffer_elements_count;
            rf_int texcoords_size = sizeof(rf_gfx_texcoord_data_type) * vertex_buffer_elements_count;
            rf_int colors_size = sizeof(rf_gfx_color_data_type) * vertex_buffer_elements_count;
            rf_int indices_size = sizeof(rf_gfx_vertex_index_data_type) * vertex_buffer_elements_count;

            char* this_buffer_memory = buffers_memory + one_vertex_buffer_memory_size * i;

            buffers[i].elements_count = vertex_buffer_elements_count;
            buffers[i].vertices       = (rf_gfx_vertex_data_type*)       this_buffer_memory;
            buffers[i].texcoords      = (rf_gfx_texcoord_data_type*)     this_buffer_memory + vertices_size;
            buffers[i].colors         = (rf_gfx_color_data_type*)        this_buffer_memory + vertices_size + texcoords_size;
            buffers[i].indices        = (rf_gfx_vertex_index_data_type*) this_buffer_memory + vertices_size + texcoords_size + colors_size;
        }

        result = rf_create_custom_render_batch_from_buffers(buffers, vertex_buffers_count, draw_calls, draw_calls_count);
    }

    return result;
}